

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoUnits.c
# Opt level: O0

void reoUnitsRecycleUnitList(reo_man *p,reo_plane *pPlane)

{
  reo_unit *local_28;
  reo_unit *pTail;
  reo_unit *pUnit;
  reo_plane *pPlane_local;
  reo_man *p_local;
  
  local_28 = (reo_unit *)0x0;
  if (pPlane->pHead != (reo_unit *)0x0) {
    for (pTail = pPlane->pHead; pTail != (reo_unit *)0x0; pTail = pTail->Next) {
      local_28 = pTail;
    }
    local_28->Next = p->pUnitFreeList;
    p->pUnitFreeList = pPlane->pHead;
    memset(pPlane,0,0x38);
  }
  return;
}

Assistant:

void reoUnitsRecycleUnitList( reo_man * p, reo_plane * pPlane )
{
    reo_unit * pUnit;
    reo_unit * pTail = NULL; // Suppress "might be used uninitialized"

    if ( pPlane->pHead == NULL )
        return;

    // find the tail
    for ( pUnit = pPlane->pHead; pUnit; pUnit = pUnit->Next )
        pTail = pUnit;
    pTail->Next = p->pUnitFreeList;
    p->pUnitFreeList    = pPlane->pHead;
    memset( pPlane, 0, sizeof(reo_plane) );
//    pPlane->pHead = NULL;
}